

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPU.cpp
# Opt level: O2

void __thiscall CPU::ROR_ZP(CPU *this)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte data;
  
  this->cycles = 5;
  bVar1 = GetByte(this);
  bVar2 = ReadByte(this,(ushort)bVar1);
  bVar3 = (this->field_6).ps << 7;
  this->cycles = this->cycles - 1;
  data = bVar3 | bVar2 >> 1;
  (this->field_6).ps = bVar3 | (data == 0) * '\x02' | (this->field_6).ps & 0x7c | bVar2 & 1;
  WriteByte(this,(ushort)bVar1,data);
  return;
}

Assistant:

void CPU::ROR_ZP()
{
    cycles = 5;
    uint8_t addr = GetByte();
    uint8_t data = ReadByte(addr);
    uint8_t cr = C ? 0b10000000 : 0;
    C = (data & 0b00000001) > 0;
    data >>= 1;
    data |= cr;
    cycles--;
    Z = (data == 0);
    N = (data & 0b10000000) > 0;
    WriteByte(addr, data);
}